

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcole.c
# Opt level: O0

int ffpcne(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          float *array,float nulvalue,int *status)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  long in_R9;
  float in_XMM0_Da;
  int *in_stack_00000008;
  int overflow;
  int tcode;
  LONGLONG fstrow;
  LONGLONG fstelm;
  LONGLONG first;
  LONGLONG repeat;
  LONGLONG ii;
  LONGLONG nbad;
  LONGLONG ngood;
  tcolumn *colptr;
  int *in_stack_00000180;
  LONGLONG in_stack_00000188;
  LONGLONG in_stack_00000190;
  LONGLONG in_stack_00000198;
  int in_stack_000001a4;
  fitsfile *in_stack_000001a8;
  float *in_stack_000071f0;
  LONGLONG in_stack_000071f8;
  LONGLONG in_stack_00007200;
  LONGLONG in_stack_00007208;
  int in_stack_00007214;
  fitsfile *in_stack_00007218;
  int *in_stack_00007260;
  long local_60;
  long local_58;
  long local_50;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_50 = 0;
  local_58 = 0;
  bVar2 = false;
  if (*in_stack_00000008 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar3 = ffrdef((fitsfile *)firstrow,(int *)firstelem), 0 < iVar3)) {
        return *in_stack_00000008;
      }
    }
    else {
      ffmahd((fitsfile *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int)((ulong)in_RDX >> 0x20),
             in_RCX,in_R8);
    }
    iVar3 = *(int *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0 + 0x50);
    if ((iVar3 < 0) &&
       (iVar4 = ffpcle(in_stack_00007218,in_stack_00007214,in_stack_00007208,in_stack_00007200,
                       in_stack_000071f8,in_stack_000071f0,in_stack_00007260), 0 < iVar4)) {
      if (*in_stack_00000008 != 0x19c) {
        return *in_stack_00000008;
      }
      *in_stack_00000008 = 0;
    }
    for (local_60 = 0; local_60 < (long)in_R8; local_60 = local_60 + 1) {
      fVar1 = *(float *)(in_R9 + local_60 * 4);
      if ((fVar1 != in_XMM0_Da) || (NAN(fVar1) || NAN(in_XMM0_Da))) {
        if (local_58 != 0) {
          iVar4 = ffpcluc(in_stack_000001a8,in_stack_000001a4,in_stack_00000198,in_stack_00000190,
                          in_stack_00000188,in_stack_00000180);
          if (0 < iVar4) {
            return *in_stack_00000008;
          }
          local_58 = 0;
        }
        local_50 = local_50 + 1;
      }
      else {
        if (local_50 != 0) {
          if ((0 < iVar3) &&
             (iVar4 = ffpcle(in_stack_00007218,in_stack_00007214,in_stack_00007208,in_stack_00007200
                             ,in_stack_000071f8,in_stack_000071f0,in_stack_00007260), 0 < iVar4)) {
            if (*in_stack_00000008 != 0x19c) {
              return *in_stack_00000008;
            }
            bVar2 = true;
            *in_stack_00000008 = 0;
          }
          local_50 = 0;
        }
        local_58 = local_58 + 1;
      }
    }
    if (local_50 == 0) {
      if (local_58 != 0) {
        ffpcluc(in_stack_000001a8,in_stack_000001a4,in_stack_00000198,in_stack_00000190,
                in_stack_00000188,in_stack_00000180);
      }
    }
    else if (0 < iVar3) {
      ffpcle(in_stack_00007218,in_stack_00007214,in_stack_00007208,in_stack_00007200,
             in_stack_000071f8,in_stack_000071f0,in_stack_00007260);
    }
    if ((*in_stack_00000008 < 1) && (bVar2)) {
      *in_stack_00000008 = 0x19c;
    }
    local_4 = *in_stack_00000008;
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int ffpcne( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            float *array,    /* I - array of values to write                */
            float  nulvalue, /* I - value used to flag undefined pixels     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels equal to the value of nulvalue will be replaced by the appropriate
  null value in the output FITS file. 

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode, overflow = 0;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    if (abs(tcode) >= TCOMPLEX)
    { /* treat complex columns as pairs of numbers */
        repeat *= 2;
    }
    
    /* if variable length array, first write the whole input vector, 
       then go back and fill in the nulls */
    if (tcode < 0) {
      if (ffpcle(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0) {
        if (*status == NUM_OVERFLOW) 
	{
	  /* ignore overflows, which are possibly the null pixel values */
	  /*  overflow = 1;   */
	  *status = 0;
	} else { 
          return(*status);
	}
      }
    }

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            /* call ffpcluc, not ffpclu, in case we are writing to a
	       complex ('C') binary table column */
            if (ffpcluc(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (tcode > 0) {  /* variable length arrays have already been written */
              if (ffpcle(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0) {
		if (*status == NUM_OVERFLOW) 
		{
		  overflow = 1;
		  *status = 0;
		} else { 
                  return(*status);
		}
              }
	    }
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      if (tcode > 0) {  /* variable length arrays have already been written */
        ffpcle(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
      }
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */
      ffpcluc(fptr, colnum, fstrow, fstelm, nbad, status);
    }
    
    if (*status <= 0) {
      if (overflow) {
        *status = NUM_OVERFLOW;
      }
    }

    return(*status);
}